

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_Diablo3.cpp
# Opt level: O0

int RootHandler_CreateDiablo3(TCascStorage *hs,LPBYTE pbRootFile,DWORD cbRootFile)

{
  LPBYTE pBVar1;
  TDiabloRoot *this;
  int local_64;
  undefined1 local_60 [4];
  int nError;
  DIABLO3_DIRECTORY RootDirectory;
  TDiabloRoot *pRootHandler;
  DWORD cbRootFile_local;
  LPBYTE pbRootFile_local;
  TCascStorage *hs_local;
  
  RootDirectory.dwNamedEntries = 0;
  RootDirectory.dwNodeIndex = 0;
  local_64 = 1000;
  pBVar1 = TDiabloRoot::CaptureDirectoryData((DIABLO3_DIRECTORY *)local_60,pbRootFile,cbRootFile);
  if (pBVar1 != (LPBYTE)0x0) {
    this = (TDiabloRoot *)operator_new(0x7b8);
    TDiabloRoot::TDiabloRoot(this);
    RootDirectory._48_8_ = this;
    if ((this != (TDiabloRoot *)0x0) &&
       (local_64 = TDiabloRoot::Load(this,hs,(DIABLO3_DIRECTORY *)local_60), local_64 != 0)) {
      if (RootDirectory._48_8_ != 0) {
        (**(code **)(*(long *)RootDirectory._48_8_ + 8))();
      }
      RootDirectory.dwNamedEntries = 0;
      RootDirectory.dwNodeIndex = 0;
    }
  }
  hs->pRootHandler = (TRootHandler *)RootDirectory._48_8_;
  return local_64;
}

Assistant:

int RootHandler_CreateDiablo3(TCascStorage * hs, LPBYTE pbRootFile, DWORD cbRootFile)
{
    TDiabloRoot * pRootHandler = NULL;
    DIABLO3_DIRECTORY RootDirectory;
    int nError = ERROR_BAD_FORMAT;

    // Verify the header of the ROOT file
    if(TDiabloRoot::CaptureDirectoryData(RootDirectory, pbRootFile, cbRootFile) != NULL)
    {
        // Allocate the root handler object
        pRootHandler = new TDiabloRoot();
        if(pRootHandler != NULL)
        {
            // Load the root directory. If load failed, we free the object
            nError = pRootHandler->Load(hs, RootDirectory);
            if(nError != ERROR_SUCCESS)
            {
                delete pRootHandler;
                pRootHandler = NULL;
            }
        }
    }

    // Assign the root directory (or NULL) and return error
    hs->pRootHandler = pRootHandler;
    return nError;
}